

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O0

string * FIX::file_appendpath(string *__return_storage_ptr__,string *path,string *file)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char local_21;
  string *psStack_20;
  char last;
  string *file_local;
  string *path_local;
  
  psStack_20 = file;
  file_local = path;
  path_local = __return_storage_ptr__;
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)path);
  local_21 = *pcVar1;
  if ((local_21 == '/') || (local_21 == '\\')) {
    std::__cxx11::string::string((string *)&local_48,(string *)file_local);
    std::operator+(__return_storage_ptr__,&local_48,psStack_20);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    std::__cxx11::string::string((string *)&local_98,(string *)file_local);
    file_separator_abi_cxx11_();
    std::operator+(&local_78,&local_98,&local_b8);
    std::operator+(__return_storage_ptr__,&local_78,psStack_20);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string file_appendpath(const std::string &path, const std::string &file) {
  const char last = path[path.size() - 1];
  if (last == '/' || last == '\\') {
    return std::string(path) + file;
  } else {
    return std::string(path) + file_separator() + file;
  }
}